

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall
r_code::list<r_exec::CInput>::push_back_new_cell(list<r_exec::CInput> *this,CInput *t)

{
  size_type sVar1;
  undefined1 local_50 [8];
  cell c;
  CInput *t_local;
  list<r_exec::CInput> *this_local;
  
  c.data.ijt = (uint64_t)t;
  cell::cell((cell *)local_50);
  r_exec::CInput::operator=((CInput *)&c.prev,(CInput *)c.data.ijt);
  local_50 = (undefined1  [8])0xffffffffffffffff;
  c.next = this->used_cells_tail;
  std::
  vector<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>::
  push_back(&this->cells,(value_type *)local_50);
  sVar1 = std::
          vector<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
          ::size(&this->cells);
  this->used_cells_tail = sVar1 - 1;
  cell::~cell((cell *)local_50);
  return;
}

Assistant:

void push_back_new_cell(const T &t)
    {
        cell c;
        c.data = t;
        c.next = null;
        c.prev = used_cells_tail;
        cells.push_back(c);
        used_cells_tail = cells.size() - 1;
    }